

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StateBlockBuilder.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_5bee2::StateBlockBuilder::defaultRender(StateBlockBuilder *this,ivec2 param_1)

{
  bool bVar1;
  Renderer *r_00;
  NamedElement *pNVar2;
  pointer pBVar3;
  element_type *this_00;
  matrix *pvm;
  char *in_RCX;
  int in_EDX;
  int in_R8D;
  int in_R9D;
  NamedElement *previewArea;
  Renderer *r;
  StateBlockBuilder *this_local;
  ivec2 param_1_local;
  
  App::r(this,(void *)param_1,in_EDX,in_RCX,in_R8D,in_R9D);
  pNVar2 = LayoutBlockBuilder::blockPreview(&this->m_layout);
  sg_apply_viewport((pNVar2->topLeft).x,(pNVar2->topLeft).y,(pNVar2->size).x,(pNVar2->size).y,true);
  pBVar3 = std::unique_ptr<BasicPit,_std::default_delete<BasicPit>_>::operator->
                     (&(this->m_physicalData).pit);
  BasicPit::draw(pBVar3,r_00);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&(this->m_physicalData).block);
  if (bVar1) {
    this_00 = std::__shared_ptr_access<BlockTemplate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<BlockTemplate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&(this->m_physicalData).block);
    pBVar3 = std::unique_ptr<BasicPit,_std::default_delete<BasicPit>_>::operator->
                       (&(this->m_physicalData).pit);
    pvm = BasicPit::projView(pBVar3);
    BlockTemplate::draw(this_00,r_00,pvm);
  }
  return;
}

Assistant:

void defaultRender(ivec2) override
    {
        auto& r = App::r();
        auto& previewArea = m_layout.blockPreview();
        sg_apply_viewport(previewArea.topLeft.x, previewArea.topLeft.y, previewArea.size.x, previewArea.size.y, true);
        m_physicalData.pit->draw(r);
        if (m_physicalData.block) m_physicalData.block->draw(r, m_physicalData.pit->projView());
    }